

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

size_t boost::detail::dynamic_bitset_impl::
       do_count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  first,size_t length,int param_3,value_to_type<true> *param_4)

{
  reference p_00;
  long in_RSI;
  byte_type *p;
  size_t num;
  byte *local_30;
  size_t local_28;
  long local_10;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8;
  
  local_28 = 0;
  if (in_RSI != 0) {
    p_00 = __gnu_cxx::
           __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           ::operator*(&local_8);
    local_30 = object_representation<unsigned_long_const>(p_00);
    local_10 = in_RSI << 3;
    do {
      local_28 = (byte)count_table<true>::table[*local_30] + local_28;
      local_30 = local_30 + 1;
      local_10 = local_10 + -1;
    } while (local_10 != 0);
  }
  return local_28;
}

Assistant:

inline std::size_t do_count(Iterator first, std::size_t length,
                                 int /*dummy param*/,
                                 value_to_type<access_by_bytes>* )
     {
         std::size_t num = 0;
         if (length)
         {
             const byte_type * p = object_representation(&*first);
             length *= sizeof(*first);

              do {
                 num += count_table<>::table[*p];
                 ++p;
                 --length;

             } while (length);
         }

         return num;
     }